

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_product_definition_sub_init(parser_info *info,char **attr)

{
  coda_format cVar1;
  coda_product_definition *pcVar2;
  node_info *pnVar3;
  char *__s1;
  int iVar4;
  char *pcVar5;
  int iVar6;
  
  pcVar2 = info->product_definition;
  if (pcVar2 != (coda_product_definition *)0x0) {
    pnVar3 = info->node;
    pnVar3->free_data = dummy_free_handler;
    pnVar3->data = pcVar2;
    pcVar5 = get_mandatory_attribute_value(attr,"id",pnVar3->tag);
    iVar6 = -1;
    if (pcVar5 != (char *)0x0) {
      __s1 = info->product_definition->name;
      iVar4 = strcmp(__s1,pcVar5);
      if (iVar4 == 0) {
        pcVar5 = get_mandatory_attribute_value(attr,"format",info->node->tag);
        if (pcVar5 != (char *)0x0) {
          iVar4 = coda_format_from_string(pcVar5,&info->node->format);
          if (iVar4 == 0) {
            pnVar3 = info->node;
            pnVar3->format_set = 1;
            cVar1 = info->product_definition->format;
            if (cVar1 == pnVar3->format) {
              if (cVar1 == coda_format_xml) {
                pnVar3->init_sub_element[0x23] = xml_root_init;
                pnVar3->add_element_to_parent[0x23] = cd_product_definition_set_root_type;
              }
              else {
                register_type_elements(pnVar3,cd_product_definition_set_root_type);
              }
              pnVar3 = info->node;
              pnVar3->init_sub_element[0x21] = cd_product_variable_init;
              pnVar3->add_element_to_parent[0x21] = cd_product_definition_add_product_variable;
              info->node->finalise_element = cd_product_definition_finalise;
              iVar6 = 0;
            }
            else {
              coda_set_error(-400,
                             "format for product definition %s differs between index and product file"
                             ,info->product_definition->name);
            }
          }
        }
      }
      else {
        coda_set_error(-400,"invalid id attribute value (%s) for product definition %s",pcVar5,__s1)
        ;
      }
    }
    return iVar6;
  }
  __assert_fail("info->product_definition != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                ,0xba3,"int cd_product_definition_sub_init(parser_info *, const char **)");
}

Assistant:

static int cd_product_definition_sub_init(parser_info *info, const char **attr)
{
    const char *id;
    const char *format_string;

    assert(info->product_definition != NULL);
    info->node->free_data = dummy_free_handler;
    info->node->data = info->product_definition;

    id = get_mandatory_attribute_value(attr, "id", info->node->tag);
    if (id == NULL)
    {
        return -1;
    }
    if (strcmp(info->product_definition->name, id) != 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid id attribute value (%s) for product definition %s", id,
                       info->product_definition->name);
        return -1;
    }
    format_string = get_mandatory_attribute_value(attr, "format", info->node->tag);
    if (format_string == NULL)
    {
        return -1;
    }
    if (coda_format_from_string(format_string, &info->node->format) != 0)
    {
        return -1;
    }
    info->node->format_set = 1;
    if (info->product_definition->format != info->node->format)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION,
                       "format for product definition %s differs between index and product file",
                       info->product_definition->name);
        return -1;
    }

    if (info->product_definition->format == coda_format_xml)
    {
        register_sub_element(info->node, element_cd_record, xml_root_init, cd_product_definition_set_root_type);
    }
    else
    {
        register_type_elements(info->node, cd_product_definition_set_root_type);
    }
    register_sub_element(info->node, element_cd_product_variable, cd_product_variable_init,
                         cd_product_definition_add_product_variable);
    info->node->finalise_element = cd_product_definition_finalise;

    return 0;
}